

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_mode(CPState *cp,CPDecl *decl)

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  long in_RSI;
  long in_RDI;
  CTSize vlen;
  CTSize sz;
  char *s;
  undefined8 in_stack_ffffffffffffffd8;
  CPToken tok;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  char *local_18;
  
  tok = (CPToken)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),tok);
  if (*(int *)(in_RDI + 4) != 0x100) goto LAB_0017cd84;
  lVar1 = *(long *)(in_RDI + 0x10);
  local_18 = (char *)(lVar1 + 0x10);
  in_stack_ffffffffffffffe4 = 0;
  in_stack_ffffffffffffffe0 = 0;
  if ((*local_18 == '_') && (*(char *)(lVar1 + 0x11) == '_')) {
    local_18 = (char *)(lVar1 + 0x12);
  }
  pcVar3 = local_18;
  if (*local_18 == 'V') {
    pcVar3 = local_18 + 2;
    in_stack_ffffffffffffffe0 = local_18[1] + -0x30;
    if (('/' < *pcVar3) && (*pcVar3 < ':')) {
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 * 10 + *pcVar3 + -0x30;
      pcVar3 = local_18 + 3;
    }
  }
  local_18 = pcVar3;
  uVar4 = (ulong)((int)*local_18 - 0x44);
  switch(uVar4) {
  case 0:
    in_stack_ffffffffffffffe4 = 8;
    break;
  default:
    goto LAB_0017cd7a;
  case 4:
    in_stack_ffffffffffffffe4 = 2;
    break;
  case 0xb:
    in_stack_ffffffffffffffe4 = 0x20;
    break;
  case 0xd:
    in_stack_ffffffffffffffe4 = 1;
    break;
  case 0xf:
    in_stack_ffffffffffffffe4 = 4;
    break;
  case 0x10:
    in_stack_ffffffffffffffe4 = 0x10;
  }
  if (((local_18[1] == 'I') || (local_18[1] == 'F')) &&
     (*(uint *)(in_RSI + 0x2c) =
           *(uint *)(in_RSI + 0x2c) & 0xffff00ff | in_stack_ffffffffffffffe4 << 8,
     in_stack_ffffffffffffffe0 != 0)) {
    uVar2 = 0x1f;
    if (in_stack_ffffffffffffffe0 * in_stack_ffffffffffffffe4 != 0) {
      for (; (uint)(in_stack_ffffffffffffffe0 * in_stack_ffffffffffffffe4) >> uVar2 == 0;
          uVar2 = uVar2 - 1) {
      }
    }
    *(uint *)(in_RSI + 0x2c) = *(uint *)(in_RSI + 0x2c) & 0xffffff0f | (uVar2 & 0xf) << 4;
  }
LAB_0017cd7a:
  cp_next((CPState *)0x17cd84);
  tok = (CPToken)(uVar4 >> 0x20);
LAB_0017cd84:
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),tok);
  return;
}

Assistant:

static void cp_decl_mode(CPState *cp, CPDecl *decl)
{
  cp_check(cp, '(');
  if (cp->tok == CTOK_IDENT) {
    const char *s = strdata(cp->str);
    CTSize sz = 0, vlen = 0;
    if (s[0] == '_' && s[1] == '_') s += 2;
    if (*s == 'V') {
      s++;
      vlen = *s++ - '0';
      if (*s >= '0' && *s <= '9')
	vlen = vlen*10 + (*s++ - '0');
    }
    switch (*s++) {
    case 'Q': sz = 1; break;
    case 'H': sz = 2; break;
    case 'S': sz = 4; break;
    case 'D': sz = 8; break;
    case 'T': sz = 16; break;
    case 'O': sz = 32; break;
    default: goto bad_size;
    }
    if (*s == 'I' || *s == 'F') {
      CTF_INSERT(decl->attr, MSIZEP, sz);
      if (vlen) CTF_INSERT(decl->attr, VSIZEP, lj_fls(vlen*sz));
    }
  bad_size:
    cp_next(cp);
  }
  cp_check(cp, ')');
}